

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O0

void __thiscall QFontComboBox::setCurrentFont(QFontComboBox *this,QFont *font)

{
  QFontComboBoxPrivate *pQVar1;
  ulong uVar2;
  QFont *in_RSI;
  QFontComboBox *in_RDI;
  QFontComboBoxPrivate *d;
  QFontComboBoxPrivate *in_stack_00000078;
  QFont *in_stack_ffffffffffffffd8;
  
  pQVar1 = d_func((QFontComboBox *)0x59a7e1);
  uVar2 = QFont::operator!=(in_RSI,&pQVar1->currentFont);
  if ((uVar2 & 1) != 0) {
    QFont::operator=(&pQVar1->currentFont,in_RSI);
    QFontComboBoxPrivate::updateModel(in_stack_00000078);
    uVar2 = QFont::operator==(&pQVar1->currentFont,in_RSI);
    if ((uVar2 & 1) != 0) {
      currentFontChanged(in_RDI,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void QFontComboBox::setCurrentFont(const QFont &font)
{
    Q_D(QFontComboBox);
    if (font != d->currentFont) {
        d->currentFont = font;
        d->updateModel();
        if (d->currentFont == font) { //else the signal has already be emitted by updateModel
            emit currentFontChanged(d->currentFont);
        }
    }
}